

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastunpack23(uint32_t *in,uint32_t *out)

{
  uint32_t *local_8;
  
  *out = *in & 0x7fffff;
  local_8 = in;
  Unroller<(unsigned_short)23,_(unsigned_short)1>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack23(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<23>::Unpack(in, out);
}